

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void V_InitFontColors(void)

{
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar1;
  undefined8 uVar2;
  TempParmInfo *pTVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  anon_union_4_2_12391d7c_for_PalEntry_0 aVar8;
  uint uVar9;
  anon_union_4_2_12391d7c_for_PalEntry_0 *paVar10;
  ulong uVar11;
  char *message;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  TranslationParm local_1c8;
  TempParmInfo info;
  TArray<FName,_FName> names;
  TArray<TempColorInfo,_TempColorInfo> colorinfo;
  long local_180;
  TArray<TranslationParm,_TranslationParm> parms;
  TempColorInfo cinfo;
  int lastlump;
  ulong local_150;
  TArray<TempParmInfo,_TempParmInfo> parminfo;
  FName local_134;
  FScanner sc;
  
  lastlump = 0;
  local_1c8.End[1] = '\0';
  local_1c8.End[2] = '\0';
  local_1c8.RangeStart = 0;
  local_1c8.RangeEnd = 0;
  local_1c8.Start[0] = '\0';
  local_1c8.Start[1] = '\0';
  local_1c8.Start[2] = '\0';
  local_1c8.End[0] = '\0';
  names.Array = (FName *)0x0;
  names.Most = 0;
  names.Count = 0;
  parms.Array = (TranslationParm *)0x0;
  parms.Most = 0;
  parms.Count = 0;
  parminfo.Array = (TempParmInfo *)0x0;
  parminfo.Most = 0;
  parminfo.Count = 0;
  colorinfo.Array = (TempColorInfo *)0x0;
  colorinfo.Most = 0;
  colorinfo.Count = 0;
  cinfo.Name.Index = 0;
  info.Index = -1;
  TArray<TranslationParm,_TranslationParm>::Clear(TranslationParms);
  TArray<TranslationParm,_TranslationParm>::Clear(TranslationParms + 1);
  TArray<TranslationMap,_TranslationMap>::Clear(&TranslationLookup);
  TArray<PalEntry,_PalEntry>::Clear(&TranslationColors);
  do {
    do {
      iVar6 = FWadCollection::FindLump(&Wads,"TEXTCOLO",&lastlump,false);
      if (iVar6 == -1) {
        iVar6 = 0;
        for (uVar14 = 0; pTVar3 = parminfo.Array, uVar14 < (ulong)colorinfo._8_8_ >> 0x20;
            uVar14 = uVar14 + 1) {
          sc.String._0_4_ = colorinfo.Array[uVar14].Name.Index;
          uVar9 = colorinfo.Array[uVar14].ParmInfo;
          iVar7 = parminfo.Array[uVar9].Index;
          if (parminfo.Array[uVar9].Index < 0) {
            for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
              for (uVar13 = 0; uVar13 < pTVar3[uVar9].ParmLen[lVar12]; uVar13 = uVar13 + 1) {
                TArray<TranslationParm,_TranslationParm>::Push
                          (TranslationParms + lVar12,
                           parms.Array + (pTVar3[uVar9].StartParm[lVar12] + uVar13));
              }
            }
            TArray<PalEntry,_PalEntry>::Push(&TranslationColors,&colorinfo.Array[uVar14].LogColor);
            pTVar3[uVar9].Index = iVar6;
            iVar7 = iVar6;
            iVar6 = iVar6 + 1;
          }
          sc.String._4_4_ = iVar7;
          TArray<TranslationMap,_TranslationMap>::Push(&TranslationLookup,(TranslationMap *)&sc);
        }
        local_1c8.RangeStart = -1;
        TArray<TranslationParm,_TranslationParm>::Push(TranslationParms,&local_1c8);
        TArray<TranslationParm,_TranslationParm>::Push(TranslationParms + 1,&local_1c8);
        qsort(TranslationLookup.Array,(ulong)TranslationLookup.Count,8,TranslationMapCompare);
        NumTextColors = iVar6;
        if (iVar6 < 0x16) {
          __assert_fail("NumTextColors >= NUM_TEXT_COLORS",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                        ,0x988,"void V_InitFontColors()");
        }
        TArray<TempColorInfo,_TempColorInfo>::~TArray(&colorinfo);
        TArray<TempParmInfo,_TempParmInfo>::~TArray(&parminfo);
        TArray<TranslationParm,_TranslationParm>::~TArray(&parms);
        TArray<FName,_FName>::~TArray(&names);
        return;
      }
    } while (((gameinfo.flags._1_1_ & 1) != 0) &&
            (iVar7 = FWadCollection::GetLumpFile(&Wads,iVar6), iVar7 == 1));
    FScanner::FScanner(&sc,iVar6);
LAB_0048a57b:
    bVar4 = FScanner::GetString(&sc);
    if (bVar4) {
      TArray<FName,_FName>::Clear(&names);
      FName::FName(&local_134,(char *)CONCAT44(sc.String._4_4_,(int)sc.String));
      TArray<FName,_FName>::Push(&names,&local_134);
      while( true ) {
        FScanner::MustGetString(&sc);
        bVar4 = FScanner::Compare(&sc,"{");
        if (bVar4) break;
        if ((names.Array)->Index == 7) {
          FScanner::ScriptError(&sc,"The \"untranslated\" color may not have any other names");
        }
        FName::FName(&local_134,(char *)CONCAT44(sc.String._4_4_,(int)sc.String));
        TArray<FName,_FName>::Push(&names,&local_134);
      }
      info.StartParm[0] = parms.Count;
      info.StartParm[1] = 0;
      info.ParmLen[0] = 0;
      info.ParmLen[1] = 0;
      aVar8.d = 0xdfdfdf;
      local_150 = 0;
      local_180 = 0;
      do {
        local_1c8._0_4_ = 0xffffffff;
LAB_0048a636:
        FScanner::MustGetString(&sc);
        bVar4 = FScanner::Compare(&sc,"}");
        if (bVar4) {
          info.ParmLen[local_180] = parms.Count - info.StartParm[local_180];
          if (info.ParmLen[0] == 0) {
            message = "There must be at least one normal range for a color";
            if ((names.Array)->Index != 7) goto LAB_0048a864;
          }
          else {
            message = "The \"untranslated\" color must be left undefined";
            if ((names.Array)->Index == 7) {
LAB_0048a864:
              FScanner::ScriptError(&sc,message);
            }
          }
          if ((info.ParmLen[1] == 0) && ((names.Array)->Index != 7)) {
            local_1c8.RangeStart = 0;
            local_1c8.RangeEnd = 0x100;
            local_1c8.Start[0] = '\0';
            local_1c8.Start[1] = '\0';
            local_1c8.Start[2] = '\0';
            local_1c8.End[0] = 0xff;
            local_1c8.End[1] = 0xff;
            local_1c8.End[2] = 0xff;
            uVar9 = TArray<TranslationParm,_TranslationParm>::Push(&parms,&local_1c8);
            info.StartParm[1] = uVar9;
            info.ParmLen[1] = 1;
          }
          cinfo.ParmInfo = TArray<TempParmInfo,_TempParmInfo>::Push(&parminfo,&info);
          uVar14 = 0;
          goto LAB_0048a8c5;
        }
        bVar4 = FScanner::Compare(&sc,"Console:");
        if (!bVar4) {
          bVar4 = FScanner::Compare(&sc,"Flat:");
          if (bVar4) {
            FScanner::MustGetString(&sc);
            aVar8.d = V_GetColor((DWORD *)0x0,&sc);
          }
          else {
            iVar6 = V_GetColor((DWORD *)0x0,&sc);
            uVar2 = local_1c8._0_8_;
            local_1c8.Start[0] = (BYTE)((uint)iVar6 >> 0x10);
            local_1c8.Start[1] = (BYTE)((uint)iVar6 >> 8);
            local_1c8.End[0] = SUB81(uVar2,7);
            local_1c8.Start[2] = (BYTE)iVar6;
            FScanner::MustGetString(&sc);
            iVar6 = V_GetColor((DWORD *)0x0,&sc);
            local_1c8.End[0] = (BYTE)((uint)iVar6 >> 0x10);
            local_1c8.End[2] = (BYTE)iVar6;
            local_1c8.End[1] = (BYTE)((uint)iVar6 >> 8);
            bVar4 = FScanner::CheckNumber(&sc);
            if (bVar4) {
              if (sc.Number != 0 && local_1c8.RangeStart == -1) {
                FScanner::ScriptError(&sc,"The first color range must start at position 0");
              }
              if (0x100 < (uint)sc.Number) {
                FScanner::ScriptError(&sc,"The color range must be within positions [0,256]");
              }
              if (sc.Number <= local_1c8.RangeEnd) {
                FScanner::ScriptError
                          (&sc,"The color range must not start before the previous one ends");
              }
              local_1c8.RangeStart = (short)sc.Number;
              FScanner::MustGetNumber(&sc);
              if (0x100 < (uint)sc.Number) {
                FScanner::ScriptError(&sc,"The color range must be within positions [0,256]");
              }
              if (sc.Number <= local_1c8.RangeStart) {
                FScanner::ScriptError
                          (&sc,"The color range end position must be larger than the start position"
                          );
              }
              local_1c8.RangeEnd = (short)sc.Number;
            }
            else {
              sVar5 = local_1c8.RangeEnd + 1;
              local_1c8.RangeEnd = 0x100;
              local_1c8.RangeStart = sVar5;
              if (0xff < sVar5) {
                FScanner::ScriptError(&sc,"The color has too many ranges");
              }
            }
            TArray<TranslationParm,_TranslationParm>::Push(&parms,&local_1c8);
          }
          goto LAB_0048a636;
        }
        if ((local_150 & 1) != 0) {
          FScanner::ScriptError(&sc,"Each color may only have one set of console ranges");
        }
        info.ParmLen[0] = parms.Count - info.StartParm[0];
        info.StartParm[1] = parms.Count;
        local_150 = CONCAT71((uint7)(uint3)(parms.Count - info.StartParm[0] >> 8),1);
        local_180 = 1;
      } while( true );
    }
    FScanner::~FScanner(&sc);
  } while( true );
LAB_0048a8c5:
  if ((ulong)names._8_8_ >> 0x20 <= uVar14) goto LAB_0048a57b;
  paVar10 = &((colorinfo.Array)->LogColor).field_0;
  for (uVar11 = 0; colorinfo.Count != uVar11; uVar11 = uVar11 + 1) {
    paVar1 = paVar10 + -2;
    iVar6._0_1_ = *(BYTE *)paVar1;
    iVar6._1_1_ = *(BYTE *)((long)paVar1 + 1);
    iVar6._2_1_ = *(BYTE *)((long)paVar1 + 2);
    iVar6._3_1_ = *(BYTE *)((long)paVar1 + 3);
    if (iVar6 == names.Array[uVar14].Index) {
      paVar10[-1].d = cinfo.ParmInfo;
      *paVar10 = aVar8;
      if (colorinfo.Count != (uint)uVar11) goto LAB_0048a92e;
      break;
    }
    paVar10 = paVar10 + 3;
  }
  cinfo.Name.Index = names.Array[uVar14].Index;
  cinfo.LogColor.field_0 = aVar8;
  TArray<TempColorInfo,_TempColorInfo>::Push(&colorinfo,&cinfo);
LAB_0048a92e:
  uVar14 = uVar14 + 1;
  goto LAB_0048a8c5;
}

Assistant:

void V_InitFontColors ()
{
	TArray<FName> names;
	int lump, lastlump = 0;
	TranslationParm tparm = { 0, 0, {0}, {0} };	// Silence GCC (for real with -Wextra )
	TArray<TranslationParm> parms;
	TArray<TempParmInfo> parminfo;
	TArray<TempColorInfo> colorinfo;
	int c, parmchoice;
	TempParmInfo info;
	TempColorInfo cinfo;
	PalEntry logcolor;
	unsigned int i, j;
	int k, index;

	info.Index = -1;

	TranslationParms[0].Clear();
	TranslationParms[1].Clear();
	TranslationLookup.Clear();
	TranslationColors.Clear();

	while ((lump = Wads.FindLump ("TEXTCOLO", &lastlump)) != -1)
	{
		if (gameinfo.flags & GI_NOTEXTCOLOR)
		{
			// Chex3 contains a bad TEXTCOLO lump, probably to force all text to be green.
			// This renders the Gray, Gold, Red and Yellow color range inoperable, some of
			// which are used by the menu. So we have no choice but to skip this lump so that
			// all colors work properly.
			// The text colors should be the end user's choice anyway.
			if (Wads.GetLumpFile(lump) == 1) continue;
		}
		FScanner sc(lump);
		while (sc.GetString())
		{
			names.Clear();

			logcolor = DEFAULT_LOG_COLOR;

			// Everything until the '{' is considered a valid name for the
			// color range.
			names.Push (sc.String);
			while (sc.MustGetString(), !sc.Compare ("{"))
			{
				if (names[0] == NAME_Untranslated)
				{
					sc.ScriptError ("The \"untranslated\" color may not have any other names");
				}
				names.Push (sc.String);
			}

			parmchoice = 0;
			info.StartParm[0] = parms.Size();
			info.StartParm[1] = 0;
			info.ParmLen[1] = info.ParmLen[0] = 0;
			tparm.RangeEnd = tparm.RangeStart = -1;

			while (sc.MustGetString(), !sc.Compare ("}"))
			{
				if (sc.Compare ("Console:"))
				{
					if (parmchoice == 1)
					{
						sc.ScriptError ("Each color may only have one set of console ranges");
					}
					parmchoice = 1;
					info.StartParm[1] = parms.Size();
					info.ParmLen[0] = info.StartParm[1] - info.StartParm[0];
					tparm.RangeEnd = tparm.RangeStart = -1;
				}
				else if (sc.Compare ("Flat:"))
				{
					sc.MustGetString();
					logcolor = V_GetColor (NULL, sc);
				}
				else
				{
					// Get first color
					c = V_GetColor (NULL, sc);
					tparm.Start[0] = RPART(c);
					tparm.Start[1] = GPART(c);
					tparm.Start[2] = BPART(c);

					// Get second color
					sc.MustGetString();
					c = V_GetColor (NULL, sc);
					tparm.End[0] = RPART(c);
					tparm.End[1] = GPART(c);
					tparm.End[2] = BPART(c);

					// Check for range specifier
					if (sc.CheckNumber())
					{
						if (tparm.RangeStart == -1 && sc.Number != 0)
						{
							sc.ScriptError ("The first color range must start at position 0");
						}
						if (sc.Number < 0 || sc.Number > 256)
						{
							sc.ScriptError ("The color range must be within positions [0,256]");
						}
						if (sc.Number <= tparm.RangeEnd)
						{
							sc.ScriptError ("The color range must not start before the previous one ends");
						}
						tparm.RangeStart = sc.Number;

						sc.MustGetNumber();
						if (sc.Number < 0 || sc.Number > 256)
						{
							sc.ScriptError ("The color range must be within positions [0,256]");
						}
						if (sc.Number <= tparm.RangeStart)
						{
							sc.ScriptError ("The color range end position must be larger than the start position");
						}
						tparm.RangeEnd = sc.Number;
					}
					else
					{
						tparm.RangeStart = tparm.RangeEnd + 1;
						tparm.RangeEnd = 256;
						if (tparm.RangeStart >= tparm.RangeEnd)
						{
							sc.ScriptError ("The color has too many ranges");
						}
					}
					parms.Push (tparm);
				}
			}
			info.ParmLen[parmchoice] = parms.Size() - info.StartParm[parmchoice];
			if (info.ParmLen[0] == 0)
			{
				if (names[0] != NAME_Untranslated)
				{
					sc.ScriptError ("There must be at least one normal range for a color");
				}
			}
			else
			{
				if (names[0] == NAME_Untranslated)
				{
					sc.ScriptError ("The \"untranslated\" color must be left undefined");
				}
			}
			if (info.ParmLen[1] == 0 && names[0] != NAME_Untranslated)
			{ // If a console translation is unspecified, make it white, since the console
			  // font has no color information stored with it.
				tparm.RangeStart = 0;
				tparm.RangeEnd = 256;
				tparm.Start[2] = tparm.Start[1] = tparm.Start[0] = 0;
				tparm.End[2] = tparm.End[1] = tparm.End[0] = 255;
				info.StartParm[1] = parms.Push (tparm);
				info.ParmLen[1] = 1;
			}
			cinfo.ParmInfo = parminfo.Push (info);
			// Record this color information for each name it goes by
			for (i = 0; i < names.Size(); ++i)
			{
				// Redefine duplicates in-place
				for (j = 0; j < colorinfo.Size(); ++j)
				{
					if (colorinfo[j].Name == names[i])
					{
						colorinfo[j].ParmInfo = cinfo.ParmInfo;
						colorinfo[j].LogColor = logcolor;
						break;
					}
				}
				if (j == colorinfo.Size())
				{
					cinfo.Name = names[i];
					cinfo.LogColor = logcolor;
					colorinfo.Push (cinfo);
				}
			}
		}
	}
	// Make permananent copies of all the color information we found.
	for (i = 0, index = 0; i < colorinfo.Size(); ++i)
	{
		TranslationMap tmap;
		TempParmInfo *pinfo;

		tmap.Name = colorinfo[i].Name;
		pinfo = &parminfo[colorinfo[i].ParmInfo];
		if (pinfo->Index < 0)
		{
			// Write out the set of remappings for this color.
			for (k = 0; k < 2; ++k)
			{
				for (j = 0; j < pinfo->ParmLen[k]; ++j)
				{
					TranslationParms[k].Push (parms[pinfo->StartParm[k] + j]);
				}
			}
			TranslationColors.Push (colorinfo[i].LogColor);
			pinfo->Index = index++;
		}
		tmap.Number = pinfo->Index;
		TranslationLookup.Push (tmap);
	}
	// Leave a terminating marker at the ends of the lists.
	tparm.RangeStart = -1;
	TranslationParms[0].Push (tparm);
	TranslationParms[1].Push (tparm);
	// Sort the translation lookups for fast binary searching.
	qsort (&TranslationLookup[0], TranslationLookup.Size(), sizeof(TranslationLookup[0]), TranslationMapCompare);

	NumTextColors = index;
	assert (NumTextColors >= NUM_TEXT_COLORS);
}